

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_udp.cpp
# Opt level: O0

TransportUDPPtr __thiscall
miniros::TransportUDP::createOutgoing
          (TransportUDP *this,string *host,int port,int connection_id,int max_datagram_size)

{
  undefined1 uVar1;
  uint uVar2;
  element_type *this_00;
  uint in_ECX;
  LogLocation *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  socklen_t in_R8D;
  TransportUDPPtr TVar3;
  bool enabled;
  TransportUDPPtr transport;
  shared_ptr<miniros::TransportUDP> *in_stack_ffffffffffffff48;
  Level level;
  LogLocation *in_stack_ffffffffffffff50;
  LogLocation *in_stack_ffffffffffffff60;
  string *name;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  undefined4 in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff94;
  undefined1 in_stack_ffffffffffffff96;
  allocator<char> in_stack_ffffffffffffff97;
  string local_68 [48];
  string local_38;
  
  name = &local_38;
  local_38.field_2._8_4_ = in_R8D;
  local_38.field_2._12_4_ = in_ECX;
  std::make_shared<miniros::TransportUDP,miniros::PollSet*&,int&,int&>
            ((PollSet **)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),(int *)in_RDX
             ,(int *)name);
  this_00 = std::
            __shared_ptr_access<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x509245);
  uVar2 = connect(this_00,(int)in_RDX,(sockaddr *)(ulong)(uint)local_38.field_2._12_4_,
                  local_38.field_2._8_4_);
  uVar1 = (undefined1)uVar2;
  if ((uVar2 & 1) == 0) {
    if (((console::g_initialized ^ 0xff) & 1) != 0) {
      console::initialize();
    }
    level = (Level)((ulong)in_stack_ffffffffffffff48 >> 0x20);
    if (((createOutgoing::loc.initialized_ ^ 0xffU) & 1) != 0) {
      in_stack_ffffffffffffff60 = (LogLocation *)&stack0xffffffffffffff97;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff97,
                          CONCAT16(in_stack_ffffffffffffff96,
                                   CONCAT24(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90))),
                 (char *)CONCAT17(uVar1,in_stack_ffffffffffffff88),(allocator<char> *)in_RDX);
      console::initializeLogLocation(in_RDX,name,(Level)((ulong)in_RDI >> 0x20));
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
    }
    if (createOutgoing::loc.level_ != Error) {
      console::setLogLocationLevel(in_stack_ffffffffffffff50,level);
      console::checkLogLocationEnabled(in_stack_ffffffffffffff60);
    }
    if ((createOutgoing::loc.logger_enabled_ & 1U) != 0) {
      console::print((FilterBase *)0x0,createOutgoing::loc.logger_,
                     (Level)(ulong)createOutgoing::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_udp.cpp"
                     ,0x2be,
                     "TransportUDPPtr miniros::TransportUDP::createOutgoing(std::string, int, int, int)"
                     ,"Failed to create outgoing connection");
    }
    std::shared_ptr<miniros::TransportUDP>::shared_ptr
              ((shared_ptr<miniros::TransportUDP> *)0x5093e3);
  }
  else {
    std::shared_ptr<miniros::TransportUDP>::shared_ptr
              ((shared_ptr<miniros::TransportUDP> *)in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff48);
  }
  std::shared_ptr<miniros::TransportUDP>::~shared_ptr((shared_ptr<miniros::TransportUDP> *)0x509414)
  ;
  TVar3.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  TVar3.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (TransportUDPPtr)
         TVar3.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TransportUDPPtr TransportUDP::createOutgoing(std::string host, int port, int connection_id, int max_datagram_size)
{
  MINIROS_ASSERT(is_server_);
  
  TransportUDPPtr transport(std::make_shared<TransportUDP>(poll_set_, flags_, max_datagram_size));
  if (!transport->connect(host, port, connection_id))
  {
    MINIROS_ERROR("Failed to create outgoing connection");
    return TransportUDPPtr();
  }
  return transport;

}